

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O3

ReturnStruct * __thiscall
miniros::master::RegistrationManager::unregisterObject
          (ReturnStruct *__return_storage_ptr__,RegistrationManager *this,Registrations *r,
          string *key,string *caller_id,string *caller_api,string *service_api)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
  *this_00;
  NodeRef *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
  pVar6;
  stringstream ss;
  string local_250;
  XmlRpcValue local_230;
  string local_220;
  XmlRpcValue local_200;
  undefined1 local_1f0 [8];
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  XmlRpcValue local_1c8;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  ostream local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  XmlRpcValue local_190 [5];
  ios_base local_138 [264];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_guard);
  if (iVar2 == 0) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
    local_200._type = TypeInvalid;
    local_200._value.asDouble = 0.0;
    ReturnStruct::ReturnStruct(__return_storage_ptr__,1,&local_250,&local_200);
    XmlRpc::XmlRpcValue::invalidate(&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    this_00 = &this->m_nodes;
    cVar3 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
            ::find(&this_00->_M_t,caller_id);
    if ((_Rb_tree_header *)cVar3._M_node == &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header) {
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(caller_id->_M_dataplus)._M_p,caller_id->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] is not a registered node",0x1a)
      ;
      ::std::__cxx11::stringbuf::str();
      local_230._type = TypeInt;
      local_230._value.asInt = 1;
      ReturnStruct::ReturnStruct((ReturnStruct *)local_1f0,0,&local_220,&local_230);
      __return_storage_ptr__->statusCode = local_1f0._0_4_;
      ::std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->statusMessage,(string *)&local_1e8);
      XmlRpc::XmlRpcValue::operator=(&__return_storage_ptr__->value,&local_1c8);
      XmlRpc::XmlRpcValue::invalidate(&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_p != &local_1d8) {
        operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
      }
      XmlRpc::XmlRpcValue::invalidate(&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      ::std::ios_base::~ios_base(local_138);
    }
    else {
      pmVar4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
               ::operator[](this_00,caller_id);
      this_01 = (pmVar4->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      this_02 = (pmVar4->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_02->_M_use_count = this_02->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_02->_M_use_count = this_02->_M_use_count + 1;
        }
      }
      Registrations::unregisterObj((ReturnStruct *)local_1b8,r,key,caller_id,caller_api,service_api)
      ;
      __return_storage_ptr__->statusCode = local_1b8._0_4_;
      ::std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->statusMessage,(string *)&local_1b0);
      XmlRpc::XmlRpcValue::operator=(&__return_storage_ptr__->value,local_190);
      XmlRpc::XmlRpcValue::invalidate(local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_p != &local_1a0) {
        operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
      }
      if (__return_storage_ptr__->statusCode == 1) {
        NodeRef::remove(this_01,(char *)(ulong)r->m_type);
      }
      bVar1 = NodeRef::is_empty(this_01);
      if (bVar1) {
        pVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
                ::equal_range(&this_00->_M_t,caller_id);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node
                      );
      }
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_guard);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

ReturnStruct RegistrationManager::unregisterObject(Registrations& r, const std::string& key,
  const std::string& caller_id, const std::string& caller_api, const std::string& service_api)
{
  std::scoped_lock<std::mutex> lock(m_guard);

  ReturnStruct ret;
  if (m_nodes.count(caller_id)) {
    std::shared_ptr<NodeRef> node_ref = m_nodes[caller_id];
    ret = r.unregisterObj(key, caller_id, caller_api, service_api);
    if (ret.statusCode == 1) {
      node_ref->remove(r.type(), key);
    }
    if (node_ref->is_empty()) {
      m_nodes.erase(caller_id);
    }
  } else {
    std::stringstream ss;
    ss << "[" << caller_id << "] is not a registered node";
    ret = ReturnStruct(0, ss.str(), RpcValue(1));
  }
  return ret;
}